

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O1

void yelp(monst *mtmp)

{
  boolean bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined **ppuVar7;
  
  if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) {
    return;
  }
  if (mtmp->data->msound == '\0') {
    return;
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
    bVar2 = mtmp->data->msound - 1;
    if (10 < bVar2) {
      pcVar6 = (char *)0x0;
      goto LAB_002453ff;
    }
    uVar4 = (ulong)bVar2;
    ppuVar7 = &PTR_anon_var_dwarf_113c14_00312f58;
  }
  else {
    uVar3 = mt_random();
    uVar4 = (ulong)(uVar3 % 0x24);
    ppuVar7 = h_sounds;
  }
  pcVar6 = ppuVar7[uVar4];
LAB_002453ff:
  if (pcVar6 == (char *)0x0) {
    return;
  }
  pcVar5 = Monnam(mtmp);
  pcVar6 = vtense((char *)0x0,pcVar6);
  pline("%s %s!",pcVar5,pcVar6);
  if (flags.run != 0) {
    nomul(0,(char *)0x0);
  }
  wake_nearto((int)mtmp->mx,(int)mtmp->my,mtmp->data->mlevel * 0xc);
  return;
}

Assistant:

void yelp(struct monst *mtmp)
{
    const char *yelp_verb = 0;

    if (mtmp->msleeping || !mtmp->mcanmove || !mtmp->data->msound)
	return;

    /* presumably nearness and soundok checks have already been made */
    if (Hallucination)
	yelp_verb = h_sounds[rn2(SIZE(h_sounds))];
    else switch (mtmp->data->msound) {
	case MS_MEW:
	    yelp_verb = "yowl";
	    break;
	case MS_BARK:
	case MS_GROWL:
	    yelp_verb = "yelp";
	    break;
	case MS_ROAR:
	    yelp_verb = "snarl";
	    break;
	case MS_SQEEK:
	    yelp_verb = "squeal";
	    break;
	case MS_SQAWK:
	    yelp_verb = "screak";
	    break;
	case MS_WAIL:
	    yelp_verb = "wail";
	    break;
    }
    if (yelp_verb) {
	pline("%s %s!", Monnam(mtmp), vtense(NULL, yelp_verb));
	if (flags.run) nomul(0, NULL);
	wake_nearto(mtmp->mx, mtmp->my, mtmp->data->mlevel * 12);
    }
}